

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.cpp
# Opt level: O2

void duckdb::ReplaceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  UnifiedVectorFormat *pUVar6;
  TemplatedValidityMask<unsigned_long> *this;
  undefined8 *puVar7;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  UnifiedVectorFormat *pUVar10;
  string_t a;
  anon_class_16_2_52ce5e5c fun;
  anon_class_16_2_52ce5e5c fun_00;
  anon_class_16_2_52ce5e5c fun_01;
  string_t sVar11;
  anon_struct_16_3_d7536bce_for_pointer aVar12;
  string_t b;
  string_t b_00;
  UnifiedVectorFormat *idx;
  vector<char,_true> buffer;
  long *local_108;
  long local_100;
  long local_f8;
  UnifiedVectorFormat bdata;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat adata;
  long local_70;
  long local_68;
  
  pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,2);
  buffer.super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  idx = *(UnifiedVectorFormat **)(args + 0x18);
  if (((*pvVar3 == (value_type)0x2) && (*pvVar4 == (value_type)0x2)) && (*pvVar5 == (value_type)0x2)
     ) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(pvVar3 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar3 + 0x28) & 1) != 0)) &&
        ((*(byte **)(pvVar4 + 0x28) == (byte *)0x0 || ((**(byte **)(pvVar4 + 0x28) & 1) != 0)))) &&
       ((*(byte **)(pvVar5 + 0x28) == (byte *)0x0 || ((**(byte **)(pvVar5 + 0x28) & 1) != 0)))) {
      paVar2 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
      fun_01.buffer = &buffer;
      fun_01.result = result;
      aVar12 = (anon_struct_16_3_d7536bce_for_pointer)
               TernaryLambdaWrapper::
               Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         (fun_01,(string_t)
                                 (*(anon_union_16_2_67f50693_for_value **)(pvVar3 + 0x20))->pointer,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(pvVar4 + 0x20))->pointer,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(pvVar5 + 0x20))->pointer,
                          (ValidityMask *)result,(idx_t)idx);
      paVar2->pointer = aVar12;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar3,idx);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,idx);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,idx);
    lVar1 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (((local_68 == 0) && (local_b0 == 0)) && (local_f8 == 0)) {
      puVar7 = (undefined8 *)(lVar1 + 8);
      for (pUVar10 = (UnifiedVectorFormat *)0x0; idx != pUVar10; pUVar10 = pUVar10 + 1) {
        pUVar6 = pUVar10;
        if (*_adata != 0) {
          pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_adata + (long)pUVar10 * 4);
        }
        pUVar8 = pUVar10;
        if (*_bdata != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar10 * 4);
        }
        pUVar9 = pUVar10;
        if (*local_108 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar10 * 4);
        }
        a.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
        a.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar6 * 0x10);
        fun.buffer = &buffer;
        fun.result = result;
        b.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar8 * 0x10);
        b.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar8 * 0x10);
        sVar11 = TernaryLambdaWrapper::
                 Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                           (fun,a,b,(string_t)
                                    ((anon_union_16_2_67f50693_for_value *)
                                    (local_100 + (long)pUVar9 * 0x10))->pointer,
                            (ValidityMask *)result,(idx_t)idx);
        puVar7[-1] = sVar11.value._0_8_;
        *puVar7 = sVar11.value._8_8_;
        puVar7 = puVar7 + 2;
      }
    }
    else {
      this = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
      puVar7 = (undefined8 *)(lVar1 + 8);
      for (pUVar10 = (UnifiedVectorFormat *)0x0; idx != pUVar10; pUVar10 = pUVar10 + 1) {
        pUVar6 = pUVar10;
        if (*_adata != 0) {
          pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_adata + (long)pUVar10 * 4);
        }
        pUVar8 = pUVar10;
        if (*_bdata != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar10 * 4);
        }
        pUVar9 = pUVar10;
        if (*local_108 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar10 * 4);
        }
        if (((local_68 == 0) ||
            ((*(ulong *)(local_68 + ((ulong)pUVar6 >> 6) * 8) >> ((ulong)pUVar6 & 0x3f) & 1) != 0))
           && (((local_b0 == 0 ||
                ((*(ulong *)(local_b0 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1) !=
                 0)) && ((local_f8 == 0 ||
                         ((*(ulong *)(local_f8 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f)
                          & 1) != 0)))))) {
          sVar11.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
          sVar11.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar6 * 0x10);
          fun_00.buffer = &buffer;
          fun_00.result = result;
          b_00.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar8 * 0x10);
          b_00.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar8 * 0x10);
          sVar11 = TernaryLambdaWrapper::
                   Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                             (fun_00,sVar11,b_00,
                              (string_t)
                              ((anon_union_16_2_67f50693_for_value *)
                              (local_100 + (long)pUVar9 * 0x10))->pointer,(ValidityMask *)result,
                              (idx_t)idx);
          puVar7[-1] = sVar11.value._0_8_;
          *puVar7 = sVar11.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(this,(idx_t)pUVar10);
        }
        puVar7 = puVar7 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buffer);
  return;
}

Assistant:

static void ReplaceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &haystack_vector = args.data[0];
	auto &needle_vector = args.data[1];
	auto &thread_vector = args.data[2];

	vector<char> buffer;
	TernaryExecutor::Execute<string_t, string_t, string_t, string_t>(
	    haystack_vector, needle_vector, thread_vector, result, args.size(),
	    [&](string_t input_string, string_t needle_string, string_t thread_string) {
		    return StringVector::AddString(result,
		                                   ReplaceScalarFunction(input_string, needle_string, thread_string, buffer));
	    });
}